

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O1

void __thiscall btConeTwistConstraint::getInfo1(btConeTwistConstraint *this,btConstraintInfo1 *info)

{
  float fVar1;
  int iVar2;
  btRigidBody *pbVar3;
  btRigidBody *pbVar4;
  int iVar5;
  
  if (this->m_useSolveConstraintObsolete == true) {
    info->m_numConstraintRows = 0;
    iVar5 = 0;
  }
  else {
    info->m_numConstraintRows = 3;
    info->nub = 3;
    pbVar3 = (this->super_btTypedConstraint).m_rbA;
    pbVar4 = (this->super_btTypedConstraint).m_rbB;
    calcAngleInfo2(this,&(pbVar3->super_btCollisionObject).m_worldTransform,
                   &(pbVar4->super_btCollisionObject).m_worldTransform,
                   (btMatrix3x3 *)&(pbVar3->super_btCollisionObject).field_0x14c,
                   (btMatrix3x3 *)&(pbVar4->super_btCollisionObject).field_0x14c);
    if (this->m_solveSwingLimit == true) {
      iVar5 = info->m_numConstraintRows;
      iVar2 = info->nub;
      info->m_numConstraintRows = iVar5 + 1;
      info->nub = iVar2 + -1;
      fVar1 = this->m_fixThresh;
      if ((this->m_swingSpan1 <= fVar1 && fVar1 != this->m_swingSpan1) &&
         (this->m_swingSpan2 <= fVar1 && fVar1 != this->m_swingSpan2)) {
        info->m_numConstraintRows = iVar5 + 2;
        info->nub = iVar2 + -2;
      }
    }
    if (this->m_solveTwistLimit != true) {
      return;
    }
    info->m_numConstraintRows = info->m_numConstraintRows + 1;
    iVar5 = info->nub + -1;
  }
  info->nub = iVar5;
  return;
}

Assistant:

void btConeTwistConstraint::getInfo1 (btConstraintInfo1* info)
{
	if (m_useSolveConstraintObsolete)
	{
		info->m_numConstraintRows = 0;
		info->nub = 0;
	} 
	else
	{
		info->m_numConstraintRows = 3;
		info->nub = 3;
		calcAngleInfo2(m_rbA.getCenterOfMassTransform(),m_rbB.getCenterOfMassTransform(),m_rbA.getInvInertiaTensorWorld(),m_rbB.getInvInertiaTensorWorld());
		if(m_solveSwingLimit)
		{
			info->m_numConstraintRows++;
			info->nub--;
			if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
			{
				info->m_numConstraintRows++;
				info->nub--;
			}
		}
		if(m_solveTwistLimit)
		{
			info->m_numConstraintRows++;
			info->nub--;
		}
	}
}